

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctstr_ieq(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  char *local_18;
  char *local_10;
  int local_4;
  
  if (in_RDI == in_RSI) {
    local_4 = 1;
  }
  else if (((in_RDI == (char *)0x0) && (in_RSI != (char *)0x0)) ||
          ((local_18 = in_RSI, local_10 = in_RDI, in_RDI != (char *)0x0 && (in_RSI == (char *)0x0)))
          ) {
    local_4 = 0;
  }
  else {
    while( true ) {
      iVar1 = tolower((int)*local_10);
      iVar2 = tolower((int)*local_18);
      if (iVar1 != iVar2) break;
      if (*local_10 == '\0') {
        return 1;
      }
      local_10 = local_10 + 1;
      local_18 = local_18 + 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
fctstr_ieq(char const *s1, char const *s2)
{
    if ( s1 == s2 )
    {
        return 1;
    }
    if ( (s1 == NULL && s2 != NULL)
            || (s1 != NULL && s2 == NULL) )
    {
        return 0;
    }
    while (tolower(*s1) == tolower(*s2))
    {
        if (*s1 == '\0')
            return 1;
        s1++;
        s2++;
    }
    /* Difference detected! */
    return 0;
}